

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_is_ech_handshake
              (ptls_t *tls,uint8_t *config_id,ptls_hpke_kem_t **kem,
              ptls_hpke_cipher_suite_t **cipher)

{
  int iVar1;
  
  iVar1 = 0;
  if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
      (undefined1  [112])0x0) {
    if (config_id != (uint8_t *)0x0) {
      *config_id = (tls->ech).config_id;
    }
    if (kem != (ptls_hpke_kem_t **)0x0) {
      *kem = (tls->ech).kem;
    }
    iVar1 = 1;
    if (cipher != (ptls_hpke_cipher_suite_t **)0x0) {
      *cipher = (tls->ech).cipher;
    }
  }
  return iVar1;
}

Assistant:

int ptls_is_ech_handshake(ptls_t *tls, uint8_t *config_id, ptls_hpke_kem_t **kem, ptls_hpke_cipher_suite_t **cipher)
{
    if (tls->ech.accepted) {
        if (config_id != NULL)
            *config_id = tls->ech.config_id;
        if (kem != NULL)
            *kem = tls->ech.kem;
        if (cipher != NULL)
            *cipher = tls->ech.cipher;
        return 1;
    }
    return 0;
}